

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

char * nk_itoa(char *s,long n)

{
  char *str;
  char cVar1;
  uint uVar2;
  char *in_RAX;
  undefined4 extraout_var;
  byte *pbVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  bVar6 = n < 0;
  if (n == 0) {
    s[0] = '0';
    s[1] = '\0';
  }
  else {
    if (bVar6) {
      *s = '-';
      n = -n;
    }
    pbVar3 = (byte *)(s + bVar6);
    do {
      *pbVar3 = (char)n + (char)((ulong)n / 10) * -10 | 0x30;
      pbVar3 = pbVar3 + 1;
      bVar6 = 9 < (ulong)n;
      n = (ulong)n / 10;
    } while (bVar6);
    *pbVar3 = 0;
    cVar1 = *s;
    str = s + (cVar1 == '-');
    uVar2 = nk_strlen(str);
    in_RAX = (char *)CONCAT44(extraout_var,uVar2);
    if (1 < (int)uVar2) {
      in_RAX = (char *)(ulong)(uVar2 >> 1);
      pcVar4 = s + (ulong)uVar2 + (ulong)(cVar1 == '-');
      pcVar5 = (char *)0x0;
      do {
        pcVar4 = pcVar4 + -1;
        cVar1 = str[(long)pcVar5];
        str[(long)pcVar5] = *pcVar4;
        *pcVar4 = cVar1;
        pcVar5 = pcVar5 + 1;
      } while (in_RAX != pcVar5);
    }
  }
  return in_RAX;
}

Assistant:

NK_LIB char*
nk_itoa(char *s, long n)
{
    long i = 0;
    if (n == 0) {
        s[i++] = '0';
        s[i] = 0;
        return s;
    }
    if (n < 0) {
        s[i++] = '-';
        n = -n;
    }
    while (n > 0) {
        s[i++] = (char)('0' + (n % 10));
        n /= 10;
    }
    s[i] = 0;
    if (s[0] == '-')
        ++s;

    nk_strrev_ascii(s);
    return s;
}